

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Plan::EdgeMaybeReady(Plan *this,iterator want_e,string *err)

{
  Edge *this_00;
  bool bVar1;
  pointer ppVar2;
  Edge *edge;
  string *err_local;
  Plan *this_local;
  iterator want_e_local;
  
  this_local = (Plan *)want_e._M_node;
  ppVar2 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->
                     ((_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_> *)&this_local);
  this_00 = ppVar2->first;
  bVar1 = Edge::AllInputsReady(this_00);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->
                       ((_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_> *)&this_local);
    if (ppVar2->second == kWantNothing) {
      bVar1 = EdgeFinished(this,this_00,kEdgeSucceeded,err);
      if (!bVar1) {
        return false;
      }
    }
    else {
      ScheduleWork(this,(iterator)this_local);
    }
  }
  return true;
}

Assistant:

bool Plan::EdgeMaybeReady(map<Edge*, Want>::iterator want_e, string* err) {
  Edge* edge = want_e->first;
  if (edge->AllInputsReady()) {
    if (want_e->second != kWantNothing) {
      ScheduleWork(want_e);
    } else {
      // We do not need to build this edge, but we might need to build one of
      // its dependents.
      if (!EdgeFinished(edge, kEdgeSucceeded, err))
        return false;
    }
  }
  return true;
}